

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O3

error convert_integer(token *token,int64_t min,int64_t max,uint64_t *result)

{
  long lVar1;
  error *tmpres___LINE__;
  long *in_R8;
  
  confirm_type(token,(token_type)min);
  if (token->filename == (char *)0x0) {
    lVar1 = *(long *)(min + 8);
    if (lVar1 < max || (long)result < lVar1) {
      fail(token,(char *)min,
           "integer \x1b[1m%d\x1b[0m is out of range, expected to be from %ld to %ld inclusively",
           lVar1,max,result);
    }
    else {
      *in_R8 = lVar1;
      token->filename = (char *)0x0;
    }
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)token;
}

Assistant:

error convert_integer(const token& token, int64_t min, int64_t max, uint64_t* result)
{
    CHECK(confirm_type(token, token_type::immediate));

    int64_t value = token.data.immediate;
    if (value < min || value > max) {
        return fail(token,
                    "integer \33[1m%d\33[0m is out of range, expected to be "
                    "from %" PRId64 " to %" PRId64 " inclusively",
                    value, min, max);
    }
    *result = static_cast<uint64_t>(value);
    return {};
}